

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  default_random_engine GENERATOR;
  char local_a;
  char local_9;
  char local_8 [8];
  
  local_8[0] = '*';
  local_8[1] = '\0';
  local_8[2] = '\0';
  local_8[3] = '\0';
  local_8[4] = '\0';
  local_8[5] = '\0';
  local_8[6] = '\0';
  local_8[7] = '\0';
  if (argc != 1) {
    if (argc == 3) {
      DemoScripts::TrainSpikingIris(&local_9,(linear_congruential_engine *)argv[1]);
    }
    else {
      DemoScripts::TrainSpikingDigits
                (&local_a,argv[1],(linear_congruential_engine *)argv[2],local_8);
    }
  }
  return 0;
}

Assistant:

int main( int argc, char **argv )
{
    const int RANDOM_SEED = 42;
    std::default_random_engine GENERATOR( RANDOM_SEED );

    if ( argc == 1 ) {
    } else if ( argc == 3 ) {
        DemoScripts().TrainSpikingIris( argv[1], GENERATOR );
    } else {
        DemoScripts().TrainSpikingDigits( argv[1], argv[2], GENERATOR, argv[3] );
    }
}